

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

Type * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
          (LLVMContext *this,LLVMContext *u,TypeID *u_1)

{
  TypeID TVar1;
  Type *pTVar2;
  
  pTVar2 = (Type *)allocate(this,0x10,8);
  if (pTVar2 != (Type *)0x0) {
    TVar1 = *u_1;
    pTVar2->context = u;
    pTVar2->type_id = TVar1;
    pTVar2->address_space = 0;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}